

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_linux.c
# Opt level: O0

STRING_HANDLE platform_get_platform_info(PLATFORM_INFO_OPTION options)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  utsname nnn;
  STRING_HANDLE result;
  PLATFORM_INFO_OPTION options_local;
  
  iVar1 = uname((utsname *)((long)&l + 2));
  if (iVar1 == 0) {
    nnn.__domainname._57_8_ =
         STRING_construct_sprintf("(native; %s; %s)",(long)&l + 2,nnn.version + 0x39);
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/platform_linux.c"
                ,"platform_get_platform_info",0x5a,1,"WARNING: failed to find machine info.");
    }
    nnn.__domainname._57_8_ = STRING_construct("(native; Linux; undefined)");
  }
  return (STRING_HANDLE)nnn.__domainname._57_8_;
}

Assistant:

STRING_HANDLE platform_get_platform_info(PLATFORM_INFO_OPTION options)
{
    // No applicable options, so ignoring parameter
    (void)options;

    // Expected format: "(<runtime name>; <operating system name>; <platform>)"

    STRING_HANDLE result;
    struct utsname nnn;

    if (uname(&nnn) == 0)
    {
        result = STRING_construct_sprintf("(native; %s; %s)", nnn.sysname, nnn.machine);
    }
    else
    {
        LogInfo("WARNING: failed to find machine info.");
        result = STRING_construct("(native; Linux; undefined)");
    }
    return result;
}